

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O0

Variant __thiscall cali::Entry::value(Entry *this,cali_id_t attr_id)

{
  cali_id_t cVar1;
  cali_variant_t cVar2;
  Node *local_30;
  Node *node;
  cali_id_t attr_id_local;
  Entry *this_local;
  
  if ((this->m_node != (Node *)0x0) && (cVar1 = Node::id(this->m_node), cVar1 == attr_id)) {
    return (Variant)(this->m_value).m_v;
  }
  local_30 = this->m_node;
  while( true ) {
    if (local_30 == (Node *)0x0) {
      Variant::Variant((Variant *)&this_local);
      return (Variant)_this_local;
    }
    cVar1 = Node::attribute(local_30);
    if (cVar1 == attr_id) break;
    local_30 = util::LockfreeIntrusiveTree<cali::Node>::parent
                         (&local_30->super_LockfreeIntrusiveTree<cali::Node>);
  }
  cVar2 = (cali_variant_t)Node::data(local_30);
  return (Variant)cVar2;
}

Assistant:

Variant Entry::value(cali_id_t attr_id) const
{
    if (m_node && m_node->id() == attr_id)
        return m_value;

    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == attr_id)
            return node->data();

    return Variant();
}